

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O3

void __thiscall cmGeneratedFileStreamBase::Open(cmGeneratedFileStreamBase *this,string *name)

{
  string *source;
  uint uVar1;
  string dir;
  string local_58 [2];
  
  cmsys::SystemTools::CollapseFullPath(local_58,name);
  std::__cxx11::string::operator=((string *)this,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58[0]._M_dataplus._M_p != &local_58[0].field_2) {
    operator_delete(local_58[0]._M_dataplus._M_p,local_58[0].field_2._M_allocated_capacity + 1);
  }
  source = &this->TempName;
  std::__cxx11::string::_M_assign((string *)source);
  std::__cxx11::string::append((char *)source);
  if ((this->TempExt)._M_string_length == 0) {
    uVar1 = cmSystemTools::RandomSeed();
    snprintf((char *)local_58,0x40,"tmp%05x",(ulong)(uVar1 & 0xfffff));
    std::__cxx11::string::append((char *)source);
  }
  else {
    std::__cxx11::string::_M_append((char *)source,(ulong)(this->TempExt)._M_dataplus._M_p);
  }
  cmsys::SystemTools::RemoveFile(source);
  cmsys::SystemTools::GetFilenamePath(local_58,source);
  cmsys::SystemTools::MakeDirectory(local_58,(mode_t *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58[0]._M_dataplus._M_p != &local_58[0].field_2) {
    operator_delete(local_58[0]._M_dataplus._M_p,local_58[0].field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratedFileStreamBase::Open(std::string const& name)
{
  // Save the original name of the file.
  this->Name = cmSystemTools::CollapseFullPath(name);

  // Create the name of the temporary file.
  this->TempName = this->Name;
#if defined(__VMS)
  this->TempName += "_";
#else
  this->TempName += ".";
#endif
  if (!this->TempExt.empty()) {
    this->TempName += this->TempExt;
  } else {
    char buf[64];
    snprintf(buf, sizeof(buf), "tmp%05x",
             cmSystemTools::RandomSeed() & 0xFFFFF);
    this->TempName += buf;
  }

  // Make sure the temporary file that will be used is not present.
  cmSystemTools::RemoveFile(this->TempName);

  std::string dir = cmSystemTools::GetFilenamePath(this->TempName);
  cmSystemTools::MakeDirectory(dir);
}